

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmInstallForeignFunction
                (jx9_vm *pVm,SyString *pName,ProcHostFunction xFunc,void *pUserData)

{
  sxu32 nKeyLen;
  void *pvVar1;
  sxi32 sVar2;
  SyHashEntry *pSVar3;
  undefined8 *pSrc;
  char *pKey;
  
  pSVar3 = SyHashGet(&pVm->hHostFunction,pName->zString,pName->nByte);
  if (pSVar3 == (SyHashEntry *)0x0) {
    pSrc = (undefined8 *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x50);
    if (pSrc == (undefined8 *)0x0) {
      return -1;
    }
    pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte);
    if (pKey != (char *)0x0) {
      SyZero(pSrc,0x50);
      pSrc[1] = pKey;
      nKeyLen = pName->nByte;
      *(sxu32 *)(pSrc + 2) = nKeyLen;
      *pSrc = pVm;
      pSrc[3] = xFunc;
      pSrc[4] = pUserData;
      pSrc[7] = 0;
      pSrc[8] = 8;
      pSrc[5] = pVm;
      pSrc[6] = 0;
      pSrc[9] = 0;
      sVar2 = SyHashInsert(&pVm->hHostFunction,pKey,nKeyLen,pSrc);
      if (sVar2 == 0) goto LAB_0010c117;
      SyMemBackendFree(&pVm->sAllocator,(void *)pSrc[1]);
    }
    SyMemBackendPoolFree(&pVm->sAllocator,pSrc);
    sVar2 = -1;
  }
  else {
    pvVar1 = pSVar3->pUserData;
    *(void **)((long)pvVar1 + 0x20) = pUserData;
    *(ProcHostFunction *)((long)pvVar1 + 0x18) = xFunc;
    *(undefined4 *)((long)pvVar1 + 0x38) = 0;
    *(undefined4 *)((long)pvVar1 + 0x44) = 0;
LAB_0010c117:
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmInstallForeignFunction(
	jx9_vm *pVm,              /* Target VM */
	const SyString *pName,    /* Foreign function name */
	ProcHostFunction xFunc,  /* Foreign function implementation */
	void *pUserData           /* Foreign function private data */
	)
{
	jx9_user_func *pFunc;
	SyHashEntry *pEntry;
	sxi32 rc;
	/* Overwrite any previously registered function with the same name */
	pEntry = SyHashGet(&pVm->hHostFunction, pName->zString, pName->nByte);
	if( pEntry ){
		pFunc = (jx9_user_func *)pEntry->pUserData;
		pFunc->pUserData = pUserData;
		pFunc->xFunc = xFunc;
		SySetReset(&pFunc->aAux);
		return SXRET_OK;
	}
	/* Create a new user function */
	rc = jx9NewForeignFunction(&(*pVm), &(*pName), xFunc, pUserData, &pFunc);
	if( rc != SXRET_OK ){
		return rc;
	}
	/* Install the function in the corresponding hashtable */
	rc = SyHashInsert(&pVm->hHostFunction, SyStringData(&pFunc->sName), pName->nByte, pFunc);
	if( rc != SXRET_OK ){
		SyMemBackendFree(&pVm->sAllocator, (void *)SyStringData(&pFunc->sName));
		SyMemBackendPoolFree(&pVm->sAllocator, pFunc);
		return rc;
	}
	/* User function successfully installed */
	return SXRET_OK;
}